

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O2

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<2UL>,_unsigned_int,_void>::
KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<2UL>,_unsigned_int,_void>
           *this,KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<2UL>,_unsigned_int,_void>
                 *oldStorage,KeyIndexStorage *actualIndex,string *notSortedStorageFilename,
          string *sortedStorageFilename,size_t indexBatchSize)

{
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *this_00;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  currentBatchIndex;
  undefined1 local_110 [24];
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
  local_f8;
  undefined1 local_f0 [16];
  long *local_e0;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:88:60)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:88:60)>
             ::_M_manager;
  IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ::OrderedStorage(&this->
                    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                   ,(InnerRegisterSupplier *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_001f5f60;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&currentBatchIndex,sortedStorageFilename,auto_format);
  this_00 = &this->sortedStorage_;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    *)(local_d8 + 0x10));
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:91:24)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:91:24)>
             ::_M_manager;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::SingleFileIndexedStorage
            (this_00,(path *)&currentBatchIndex,
             (shared_ptr<supermap::io::FileManager> *)(local_d8 + 0x10),
             (InnerRegisterSupplier *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::filesystem::__cxx11::path::~path((path *)&currentBatchIndex);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&currentBatchIndex,notSortedStorageFilename,auto_format);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    *)local_f0);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:94:27)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:94:27)>
             ::_M_manager;
  local_f8._M_t.
  super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
  .
  super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>,_true,_true>
        )(__uniq_ptr_data<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>,_true,_true>
          )&this->notSortedStorage_;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&this->notSortedStorage_,(path *)&currentBatchIndex,
             (shared_ptr<supermap::io::FileManager> *)local_f0,(InnerRegisterSupplier *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  std::filesystem::__cxx11::path::~path((path *)&currentBatchIndex);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::function(&this->innerRegisterSupplier_,&oldStorage->innerRegisterSupplier_);
  local_110._16_8_ = &this->innerRegisterSupplier_;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::getDataIterator((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                     *)local_110);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    *)local_d8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<2ul>>,unsigned_int,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_b8,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<2ul>>,unsigned_int,void>
              *)this_00);
  std::filesystem::__cxx11::path::path((path *)&currentBatchIndex,&local_b8,auto_format);
  (*((Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_void>_>
      *)local_d8._0_8_)->_vptr_Cloneable[1])(&local_e0,local_d8._0_8_,&currentBatchIndex,0);
  std::filesystem::__cxx11::path::~path((path *)&currentBatchIndex);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  io::InputIterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,5ul,void>::
  collectWith<supermap::io::InputIterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,5ul,void>::collect(unsigned_int)::_lambda(auto:1&&,unsigned_int)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
            (&currentBatchIndex,local_110,indexBatchSize & 0xffffffff);
  (*(this->sortedStorage_).
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
    .
    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->sortedStorage_).
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
              .
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
              .register_,
             (ulong)(this->sortedStorage_).
                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    .
                    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    .
                    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<2UL>_>,_unsigned_int,_void>
                    .register_.count_);
  while( true ) {
    if (currentBatchIndex.
        super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        currentBatchIndex.
        super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<2ul>>,unsigned_int,void>
    ::
    appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<2ul>,unsigned_int,void>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<2ul>,unsigned_int,void>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void,supermap::Key<1ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda(supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const&)_1_,supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<2ul>>,void>
              ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<2ul>>,unsigned_int,void>
                *)this_00,
               (__normal_iterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_*,_std::vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                )currentBatchIndex.
                 super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_*,_std::vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                )currentBatchIndex.
                 super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_9d0d8c12)oldStorage);
    io::InputIterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,5ul,void>::
    collectWith<supermap::io::InputIterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,5ul,void>::collect(unsigned_int)::_lambda(auto:1&&,unsigned_int)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
              (&local_b8,local_110,indexBatchSize & 0xffffffff);
    std::
    vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
    ::_M_move_assign(&currentBatchIndex,&local_b8);
    std::
    _Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
    ::~_Vector_base((_Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                     *)&local_b8);
  }
  (**(code **)(*local_e0 + 8))();
  std::
  _Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::~_Vector_base(&currentBatchIndex.
                   super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 );
  (**(code **)(*local_e0 + 0x18))();
  if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_110._0_8_ + 0x18))();
  }
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const KeyValueShrinkableStorage &oldStorage,
        const KeyIndexStorage &actualIndex,
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::size_t indexBatchSize
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       oldStorage.getFileManager(),
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          oldStorage.getFileManager(),
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(oldStorage.innerRegisterSupplier_) {
        auto indexIterator = actualIndex.getDataIterator();
        io::OutputIterator<KV> keyValueOutputIterator
            = getFileManager()->template getOutputIterator<KV>(
                sortedStorage_.getStorageFilePath(),
                false
            );
        std::vector<KeyIndex> currentBatchIndex = indexIterator.collect(indexBatchSize);
        sortedStorage_.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!currentBatchIndex.empty()) {
            sortedStorage_.appendAll(
                currentBatchIndex.begin(),
                currentBatchIndex.end(),
                [&](const KeyIndex &keyIndex) {
                    return KeyValue{
                        keyIndex.key,
                        oldStorage.get(keyIndex.value).value
                    };
                }
            );
            currentBatchIndex = indexIterator.collect(indexBatchSize);
        }
        keyValueOutputIterator.flush();
    }